

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::comptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  undefined8 *puVar1;
  Type TVar2;
  StructT *pSVar3;
  Signature signature;
  string local_d8;
  undefined1 auStack_b8 [8];
  MaybeResult<wasm::Signature> _val;
  __index_type local_88;
  undefined1 auStack_80 [8];
  MaybeResult<wasm::Signature> type;
  __index_type local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  functype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Signature> *)auStack_80,ctx);
  if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_80)
    ;
    conttype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Continuation> *)auStack_80,ctx);
    if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
    {
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        auStack_80);
      structtype<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                  *)auStack_80,ctx);
      if (local_50 == '\x01') {
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                             *)auStack_80);
        arraytype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Array> *)auStack_80,ctx);
        if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
            '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                            auStack_80);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"expected type description","");
          Lexer::err((Err *)auStack_80,&ctx->in,&local_d8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          TVar2.id = (long)&type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err> + 8;
          if (auStack_80 == (undefined1  [8])TVar2.id) {
            *puVar1 = CONCAT71(type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               _M_u._M_first._M_storage.results.id._1_7_,
                               type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                               _M_u._M_first._M_storage.results.id._0_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                 type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> = auStack_80;
            *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>
                              .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
                 CONCAT71(type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                          _M_first._M_storage.results.id._1_7_,
                          type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                          _M_first._M_storage.results.id._0_1_);
          }
          ((Type *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->id =
               (uintptr_t)
               type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first.
               _M_storage.params.id;
          type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first.
          _M_storage.params.id = (Type)0;
          type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first.
          _M_storage.results.id._0_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            auStack_80 = (undefined1  [8])TVar2;
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_b8,
                          (_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_80);
          if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
              '\x02') {
            local_48 = &local_38;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_48,auStack_b8,
                       (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                             _M_u._M_first._M_storage.params.id + (long)auStack_b8);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
            if (local_48 == &local_38) {
              *puVar1 = local_38;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
            }
            else {
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_38;
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
            std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                              auStack_b8);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                              auStack_b8);
            pSVar3 = (StructT *)0x0;
            if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                '\0') {
              pSVar3 = (StructT *)auStack_80;
            }
            auStack_b8 = *(undefined1 (*) [8])
                          &((_Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                             *)&pSVar3->first)->_M_u;
            _val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first.
            _M_storage.params.id =
                 (Type)*(uintptr_t *)
                        ((long)&((_Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                                  *)&pSVar3->first)->_M_u + 8);
            TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,(Array *)auStack_b8);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                            auStack_80);
        }
      }
      else {
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)auStack_b8,
                          (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)auStack_80);
        if (local_88 == '\x02') {
          local_48 = &local_38;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_48,auStack_b8,
                     (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u
                           ._M_first._M_storage.params.id + (long)auStack_b8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          if (local_48 == &local_38) {
            *puVar1 = local_38;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
          }
          else {
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_38;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
          std::__detail::__variant::
          _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                               *)auStack_b8);
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                               *)auStack_b8);
          pSVar3 = (StructT *)0x0;
          if (local_50 == '\0') {
            pSVar3 = (StructT *)auStack_80;
          }
          ParseTypeDefsCtx::addStructType(ctx,pSVar3);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                             *)auStack_80);
      }
    }
    else {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                      auStack_b8,
                      (_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                      auStack_80);
      if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02'
         ) {
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_48,auStack_b8,
                   (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                         _M_first._M_storage.params.id + (long)auStack_b8);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_48 == &local_38) {
          *puVar1 = local_38;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_38;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                            auStack_b8);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                            auStack_b8);
        TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,(Continuation)auStack_80);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        auStack_80);
    }
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_b8,
                    (_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_80);
    if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
    {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,auStack_b8,
                 (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.params.id + (long)auStack_b8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_48 == &local_38) {
        *puVar1 = local_38;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
      }
      else {
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_38;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)
                        auStack_b8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)
                        auStack_b8);
      pSVar3 = (StructT *)0x0;
      if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0')
      {
        pSVar3 = (StructT *)auStack_80;
      }
      signature.results.id =
           *(uintptr_t *)
            ((long)&((_Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                      *)&pSVar3->first)->_M_u + 8);
      signature.params.id = (uintptr_t)auStack_80;
      TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,signature);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_80)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> comptype(Ctx& ctx) {
  if (auto type = functype(ctx)) {
    CHECK_ERR(type);
    ctx.addFuncType(*type);
    return Ok{};
  }
  if (auto type = conttype(ctx)) {
    CHECK_ERR(type);
    ctx.addContType(*type);
    return Ok{};
  }
  if (auto type = structtype(ctx)) {
    CHECK_ERR(type);
    ctx.addStructType(*type);
    return Ok{};
  }
  if (auto type = arraytype(ctx)) {
    CHECK_ERR(type);
    ctx.addArrayType(*type);
    return Ok{};
  }
  return ctx.in.err("expected type description");
}